

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvcStreamReader.cpp
# Opt level: O0

void __thiscall VVCStreamReader::incTimings(VVCStreamReader *this)

{
  int iVar1;
  ostream *poVar2;
  int delta;
  VVCStreamReader *this_local;
  
  iVar1 = (this->super_MPEGStreamReader).m_totalFrameNum;
  (this->super_MPEGStreamReader).m_totalFrameNum = iVar1 + 1;
  if (0 < iVar1) {
    (this->super_MPEGStreamReader).m_curDts =
         (this->super_MPEGStreamReader).m_pcrIncPerFrame + (this->super_MPEGStreamReader).m_curDts;
  }
  iVar1 = this->m_frameNum - this->m_fullPicOrder;
  (this->super_MPEGStreamReader).m_curPts =
       (this->super_MPEGStreamReader).m_curDts -
       (long)iVar1 * (this->super_MPEGStreamReader).m_pcrIncPerFrame;
  this->m_frameNum = this->m_frameNum + 1;
  this->m_firstFrame = false;
  if (this->m_frameDepth < iVar1) {
    this->m_frameDepth = iVar1;
    poVar2 = std::operator<<((ostream *)&std::cout,"B-pyramid level ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_frameDepth + -1);
    poVar2 = std::operator<<(poVar2," detected. Shift DTS to ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_frameDepth);
    poVar2 = std::operator<<(poVar2," frames");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    sLastMsg = true;
  }
  return;
}

Assistant:

void VVCStreamReader::incTimings()
{
    if (m_totalFrameNum++ > 0)
        m_curDts += m_pcrIncPerFrame;
    const int delta = m_frameNum - m_fullPicOrder;
    m_curPts = m_curDts - delta * m_pcrIncPerFrame;
    m_frameNum++;
    m_firstFrame = false;

    if (delta > m_frameDepth)
    {
        m_frameDepth = delta;
        LTRACE(LT_INFO, 2,
               "B-pyramid level " << m_frameDepth - 1 << " detected. Shift DTS to " << m_frameDepth << " frames");
    }
}